

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Reader.cpp
# Opt level: O1

StepStatus __thiscall
adios2::core::engine::BP5Reader::CheckForNewSteps(BP5Reader *this,Seconds timeoutSeconds)

{
  ulong uVar1;
  bool bVar2;
  StepStatus SVar3;
  long lVar4;
  BP5Reader *this_00;
  Seconds pollSeconds;
  TimePoint timeoutInstant;
  Seconds local_68;
  Seconds local_60;
  Seconds local_58;
  TimePoint local_50;
  double local_48;
  undefined8 uStack_40;
  
  local_68.__r = (rep_conflict)
                 (~-(ulong)(timeoutSeconds.__r < 0.0) & (ulong)timeoutSeconds.__r |
                 -(ulong)(timeoutSeconds.__r < 0.0) & 0x41cdcd64ff800000);
  uStack_40 = 0;
  local_48 = local_68.__r;
  lVar4 = std::chrono::_V2::steady_clock::now();
  local_50.__d.__r = (duration)(local_48 * 1000000000.0 + (double)lVar4);
  local_58.__r = (rep_conflict)(this->super_BP5Engine).m_Parameters.BeginStepPollingFrequencySecs;
  if (local_48 < local_58.__r) {
    local_58.__r = local_68.__r;
  }
  local_48 = local_58.__r / 10.0;
  uVar1 = this->m_StepsCount;
  do {
    local_60.__r = local_48;
    UpdateBuffer(this,&local_50,&local_60,&local_68);
    if (uVar1 < this->m_StepsCount) break;
    this_00 = this;
    bVar2 = CheckWriterActive(this);
    if (!bVar2) {
      local_60.__r = local_48;
      UpdateBuffer(this,&local_50,&local_60,&local_68);
      break;
    }
    bVar2 = SleepOrQuit(this_00,&local_50,&local_58);
  } while (bVar2);
  SVar3 = OK;
  if (this->m_StepsCount <= uVar1) {
    ((this->super_Engine).m_IO)->m_ReadStreaming = false;
    SVar3 = EndOfStream - this->m_WriterIsActive;
  }
  return SVar3;
}

Assistant:

StepStatus BP5Reader::CheckForNewSteps(Seconds timeoutSeconds)
{
    /* Do a collective wait for a step within timeout.
       Make sure every reader comes to the same conclusion */
    StepStatus retval = StepStatus::OK;

    if (timeoutSeconds < Seconds::zero())
    {
        timeoutSeconds = Seconds(999999999); // max 1 billion seconds wait
    }
    const TimePoint timeoutInstant = Now() + timeoutSeconds;

    auto pollSeconds = Seconds(m_Parameters.BeginStepPollingFrequencySecs);
    if (pollSeconds > timeoutSeconds)
    {
        pollSeconds = timeoutSeconds;
    }

    /* Poll */
    const auto stepsBefore = m_StepsCount;
    do
    {
        UpdateBuffer(timeoutInstant, pollSeconds / 10, timeoutSeconds);
        if (m_StepsCount > stepsBefore)
        {
            break;
        }
        if (!CheckWriterActive())
        {
            /* Race condition: When checking data in UpdateBuffer, new
             * step(s) may have not arrived yet. When checking active flag,
             * the writer may have completed write and terminated. So we may
             * have missed a step or two. */
            UpdateBuffer(timeoutInstant, pollSeconds / 10, timeoutSeconds);
            break;
        }
    } while (SleepOrQuit(timeoutInstant, pollSeconds));

    if (m_StepsCount > stepsBefore)
    {
        /* we have got new steps and new metadata in memory */
        retval = StepStatus::OK;
    }
    else
    {
        m_IO.m_ReadStreaming = false;
        if (m_WriterIsActive)
        {
            retval = StepStatus::NotReady;
        }
        else
        {
            retval = StepStatus::EndOfStream;
        }
    }
    return retval;
}